

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excerpt_appender.cpp
# Opt level: O0

void __thiscall
cornelich::excerpt_appender::set_last_written_index
          (excerpt_appender *this,int64_t cycle,int64_t index_count,int64_t index_position)

{
  int64_t iVar1;
  __atomic_base<long> _Var2;
  atomic_int_fast64_t *paVar3;
  __atomic_base<long> local_88;
  int64_t lwi;
  int64_t last_written_index;
  int64_t index_position_local;
  int64_t index_count_local;
  int64_t cycle_local;
  excerpt_appender *this_local;
  int64_t local_50;
  __atomic_base<long> *local_48;
  atomic_int_fast64_t *local_40;
  bool local_31;
  int64_t local_30;
  memory_order local_28;
  undefined4 local_24;
  int64_t local_20;
  __atomic_base<long> *local_18;
  atomic_int_fast64_t *local_10;
  
  last_written_index = index_position;
  index_position_local = index_count;
  index_count_local = cycle;
  cycle_local = (int64_t)this;
  lwi = index_from(this,cycle,index_count,index_position);
  this->m_last_written_index = lwi;
  do {
    local_88._M_i = vanilla_chronicle::last_written_index(this->m_chronicle);
    iVar1 = lwi;
    if (lwi <= local_88._M_i) {
      return;
    }
    paVar3 = &this->m_chronicle->m_last_written_index;
    local_50 = lwi;
    this_local._4_4_ = 5;
    local_48 = &local_88;
    local_40 = paVar3;
    local_28 = std::__cmpexch_failure_order(memory_order_seq_cst);
    local_20 = iVar1;
    local_24 = 5;
    local_30 = iVar1;
    switch(0x24eec3) {
    default:
      if (local_28 - memory_order_consume < 2) {
        LOCK();
        _Var2._M_i = (paVar3->super___atomic_base<long>)._M_i;
        local_31 = local_88._M_i == _Var2._M_i;
        if (local_31) {
          (paVar3->super___atomic_base<long>)._M_i = iVar1;
          _Var2._M_i = local_88._M_i;
        }
        UNLOCK();
        if (!local_31) {
          local_88._M_i = _Var2._M_i;
        }
      }
      else if (local_28 == memory_order_seq_cst) {
        LOCK();
        _Var2._M_i = (paVar3->super___atomic_base<long>)._M_i;
        local_31 = local_88._M_i == _Var2._M_i;
        if (local_31) {
          (paVar3->super___atomic_base<long>)._M_i = iVar1;
          _Var2._M_i = local_88._M_i;
        }
        UNLOCK();
        if (!local_31) {
          local_88._M_i = _Var2._M_i;
        }
      }
      else {
        LOCK();
        _Var2._M_i = (paVar3->super___atomic_base<long>)._M_i;
        local_31 = local_88._M_i == _Var2._M_i;
        if (local_31) {
          (paVar3->super___atomic_base<long>)._M_i = iVar1;
          _Var2._M_i = local_88._M_i;
        }
        UNLOCK();
        if (!local_31) {
          local_88._M_i = _Var2._M_i;
        }
      }
      break;
    case 2:
      if (local_28 - memory_order_consume < 2) {
        LOCK();
        _Var2._M_i = (paVar3->super___atomic_base<long>)._M_i;
        local_31 = local_88._M_i == _Var2._M_i;
        if (local_31) {
          (paVar3->super___atomic_base<long>)._M_i = iVar1;
          _Var2._M_i = local_88._M_i;
        }
        UNLOCK();
        if (!local_31) {
          local_88._M_i = _Var2._M_i;
        }
      }
      else if (local_28 == memory_order_seq_cst) {
        LOCK();
        _Var2._M_i = (paVar3->super___atomic_base<long>)._M_i;
        local_31 = local_88._M_i == _Var2._M_i;
        if (local_31) {
          (paVar3->super___atomic_base<long>)._M_i = iVar1;
          _Var2._M_i = local_88._M_i;
        }
        UNLOCK();
        if (!local_31) {
          local_88._M_i = _Var2._M_i;
        }
      }
      else {
        LOCK();
        _Var2._M_i = (paVar3->super___atomic_base<long>)._M_i;
        local_31 = local_88._M_i == _Var2._M_i;
        if (local_31) {
          (paVar3->super___atomic_base<long>)._M_i = iVar1;
          _Var2._M_i = local_88._M_i;
        }
        UNLOCK();
        if (!local_31) {
          local_88._M_i = _Var2._M_i;
        }
      }
      break;
    case 3:
      if (local_28 - memory_order_consume < 2) {
        LOCK();
        _Var2._M_i = (paVar3->super___atomic_base<long>)._M_i;
        local_31 = local_88._M_i == _Var2._M_i;
        if (local_31) {
          (paVar3->super___atomic_base<long>)._M_i = iVar1;
          _Var2._M_i = local_88._M_i;
        }
        UNLOCK();
        if (!local_31) {
          local_88._M_i = _Var2._M_i;
        }
      }
      else if (local_28 == memory_order_seq_cst) {
        LOCK();
        _Var2._M_i = (paVar3->super___atomic_base<long>)._M_i;
        local_31 = local_88._M_i == _Var2._M_i;
        if (local_31) {
          (paVar3->super___atomic_base<long>)._M_i = iVar1;
          _Var2._M_i = local_88._M_i;
        }
        UNLOCK();
        if (!local_31) {
          local_88._M_i = _Var2._M_i;
        }
      }
      else {
        LOCK();
        _Var2._M_i = (paVar3->super___atomic_base<long>)._M_i;
        local_31 = local_88._M_i == _Var2._M_i;
        if (local_31) {
          (paVar3->super___atomic_base<long>)._M_i = iVar1;
          _Var2._M_i = local_88._M_i;
        }
        UNLOCK();
        if (!local_31) {
          local_88._M_i = _Var2._M_i;
        }
      }
      break;
    case 4:
      if (local_28 - memory_order_consume < 2) {
        LOCK();
        _Var2._M_i = (paVar3->super___atomic_base<long>)._M_i;
        local_31 = local_88._M_i == _Var2._M_i;
        if (local_31) {
          (paVar3->super___atomic_base<long>)._M_i = iVar1;
          _Var2._M_i = local_88._M_i;
        }
        UNLOCK();
        if (!local_31) {
          local_88._M_i = _Var2._M_i;
        }
      }
      else if (local_28 == memory_order_seq_cst) {
        LOCK();
        _Var2._M_i = (paVar3->super___atomic_base<long>)._M_i;
        local_31 = local_88._M_i == _Var2._M_i;
        if (local_31) {
          (paVar3->super___atomic_base<long>)._M_i = iVar1;
          _Var2._M_i = local_88._M_i;
        }
        UNLOCK();
        if (!local_31) {
          local_88._M_i = _Var2._M_i;
        }
      }
      else {
        LOCK();
        _Var2._M_i = (paVar3->super___atomic_base<long>)._M_i;
        local_31 = local_88._M_i == _Var2._M_i;
        if (local_31) {
          (paVar3->super___atomic_base<long>)._M_i = iVar1;
          _Var2._M_i = local_88._M_i;
        }
        UNLOCK();
        if (!local_31) {
          local_88._M_i = _Var2._M_i;
        }
      }
    }
    local_18 = &local_88;
    local_10 = paVar3;
  } while (local_31 == false);
  return;
}

Assistant:

void excerpt_appender::set_last_written_index(std::int64_t cycle, std::int64_t index_count, std::int64_t index_position)
{
    std::int64_t last_written_index = index_from(cycle, index_count, index_position);
    m_last_written_index = last_written_index;
    while(true)
    {
        std::int64_t lwi = m_chronicle.last_written_index();
        if(lwi >= last_written_index || m_chronicle.m_last_written_index.compare_exchange_weak(lwi, last_written_index))
            break;
    }
}